

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O3

void __thiscall DataBuffer::copyBuffer(DataBuffer *this,DataBuffer *buf)

{
  checkSpace(this,*(int *)&buf->m_position - *(int *)&buf->m_buffer);
  memcpy(this->m_position,buf->m_buffer,(long)(*(int *)&buf->m_position - (int)buf->m_buffer));
  this->m_position = this->m_position + (*(int *)&buf->m_position - *(int *)&buf->m_buffer);
  return;
}

Assistant:

void DataBuffer::copyBuffer (const DataBuffer* buf)
{
	checkSpace (buf->writtenSize());
	memcpy (m_position, buf->buffer(), buf->writtenSize());
	m_position += buf->writtenSize();
}